

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnd.h
# Opt level: O3

void rnd_well_seed(rnd_well_t *well,uint seed)

{
  uint uVar1;
  int i;
  long lVar2;
  
  uVar1 = (seed * 2 >> 0x10 ^ seed * 2 + 1) * -0x7a143595;
  uVar1 = (uVar1 >> 0xd ^ uVar1) * -0x3d4d51cb;
  well->state[0x10] = 0;
  uVar1 = uVar1 >> 0x10 ^ uVar1 ^ 0xf68a9fc1;
  well->state[0] = uVar1;
  lVar2 = 1;
  do {
    uVar1 = (uVar1 >> 0x1e ^ uVar1) * 0x6c078965 + (int)lVar2;
    well->state[lVar2] = uVar1;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x10);
  return;
}

Assistant:

void rnd_well_seed( rnd_well_t* well, RND_U32 seed )
    {
    RND_U32 value = rnd_internal_murmur3_avalanche32( ( seed << 1U ) | 1U );
    well->state[ 16 ] = 0;
    well->state[ 0 ] = value ^ 0xf68a9fc1U;
    for( int i = 1; i < 16; ++i ) 
        well->state[ i ] = ( 0x6c078965U * ( well->state[ i - 1 ] ^ ( well->state[ i - 1 ] >> 30 ) ) + i ); 
    }